

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<bool,bool,bool>::
IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<bool>::operator!=
                    ((ParamIterator<bool> *)(this + 0x40),(ParamIterator<bool> *)(this + 0x28));
  if (bVar1) {
    return;
  }
  ParamIterator<bool>::operator=
            ((ParamIterator<bool> *)(this + 0x40),(ParamIterator<bool> *)(this + 0x10));
  (**(code **)(**(long **)(this + 0x48) + 0x18))();
  AdvanceIfEnd<1ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }